

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

ON_Xform * __thiscall
ON_Xform::operator*(ON_Xform *__return_storage_ptr__,ON_Xform *this,ON_Xform *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double m [4] [4];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  dVar1 = this->m_xform[0][0];
  dVar2 = this->m_xform[0][1];
  dVar3 = rhs->m_xform[0][0];
  dVar4 = rhs->m_xform[1][0];
  dVar5 = this->m_xform[0][2];
  dVar6 = rhs->m_xform[2][0];
  dVar7 = this->m_xform[0][3];
  dVar8 = rhs->m_xform[3][0];
  local_88 = dVar7 * dVar8 + dVar5 * dVar6 + dVar1 * dVar3 + dVar2 * dVar4;
  dVar9 = rhs->m_xform[0][1];
  dVar10 = rhs->m_xform[1][1];
  dVar11 = rhs->m_xform[2][1];
  dVar12 = rhs->m_xform[3][1];
  local_80 = dVar7 * dVar12 + dVar5 * dVar11 + dVar1 * dVar9 + dVar2 * dVar10;
  dVar13 = rhs->m_xform[0][2];
  dVar14 = rhs->m_xform[1][2];
  dVar15 = rhs->m_xform[2][2];
  dVar16 = rhs->m_xform[3][2];
  local_78 = dVar7 * dVar16 + dVar5 * dVar15 + dVar1 * dVar13 + dVar2 * dVar14;
  dVar17 = rhs->m_xform[1][3];
  dVar18 = rhs->m_xform[0][3];
  dVar19 = rhs->m_xform[2][3];
  dVar20 = rhs->m_xform[3][3];
  local_70 = dVar7 * dVar20 + dVar5 * dVar19 + dVar1 * dVar18 + dVar2 * dVar17;
  dVar1 = this->m_xform[1][1];
  dVar2 = this->m_xform[1][0];
  dVar5 = this->m_xform[1][2];
  dVar7 = this->m_xform[1][3];
  local_68 = dVar7 * dVar8 + dVar5 * dVar6 + dVar2 * dVar3 + dVar4 * dVar1;
  local_60 = dVar7 * dVar12 + dVar5 * dVar11 + dVar2 * dVar9 + dVar10 * dVar1;
  local_58 = dVar7 * dVar16 + dVar5 * dVar15 + dVar2 * dVar13 + dVar14 * dVar1;
  local_50 = dVar7 * dVar20 + dVar5 * dVar19 + dVar2 * dVar18 + dVar1 * dVar17;
  dVar1 = this->m_xform[2][1];
  dVar2 = this->m_xform[2][0];
  dVar5 = this->m_xform[2][2];
  dVar7 = this->m_xform[2][3];
  local_48 = dVar7 * dVar8 + dVar5 * dVar6 + dVar2 * dVar3 + dVar4 * dVar1;
  local_40 = dVar7 * dVar12 + dVar5 * dVar11 + dVar2 * dVar9 + dVar10 * dVar1;
  local_38 = dVar7 * dVar16 + dVar5 * dVar15 + dVar2 * dVar13 + dVar14 * dVar1;
  local_30 = dVar7 * dVar20 + dVar5 * dVar19 + dVar2 * dVar18 + dVar1 * dVar17;
  dVar1 = this->m_xform[3][1];
  dVar2 = this->m_xform[3][0];
  dVar5 = this->m_xform[3][2];
  dVar7 = this->m_xform[3][3];
  local_28 = dVar8 * dVar7 + dVar6 * dVar5 + dVar3 * dVar2 + dVar4 * dVar1;
  local_20 = dVar12 * dVar7 + dVar11 * dVar5 + dVar9 * dVar2 + dVar10 * dVar1;
  local_18 = dVar16 * dVar7 + dVar15 * dVar5 + dVar13 * dVar2 + dVar14 * dVar1;
  local_10 = dVar7 * dVar20 + dVar5 * dVar19 + dVar2 * dVar18 + dVar17 * dVar1;
  ON_Xform(__return_storage_ptr__,(double (*) [4])&local_88);
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_Xform::operator*( const ON_Xform& rhs ) const
{
  double m[4][4];
  const double* p = &rhs.m_xform[0][0];

  m[0][0] = m_xform[0][0]*p[0] + m_xform[0][1]*p[4] + m_xform[0][2]*p[ 8] + m_xform[0][3]*p[12];
  m[0][1] = m_xform[0][0]*p[1] + m_xform[0][1]*p[5] + m_xform[0][2]*p[ 9] + m_xform[0][3]*p[13];
  m[0][2] = m_xform[0][0]*p[2] + m_xform[0][1]*p[6] + m_xform[0][2]*p[10] + m_xform[0][3]*p[14];
  m[0][3] = m_xform[0][0]*p[3] + m_xform[0][1]*p[7] + m_xform[0][2]*p[11] + m_xform[0][3]*p[15];

  m[1][0] = m_xform[1][0]*p[0] + m_xform[1][1]*p[4] + m_xform[1][2]*p[ 8] + m_xform[1][3]*p[12];
  m[1][1] = m_xform[1][0]*p[1] + m_xform[1][1]*p[5] + m_xform[1][2]*p[ 9] + m_xform[1][3]*p[13];
  m[1][2] = m_xform[1][0]*p[2] + m_xform[1][1]*p[6] + m_xform[1][2]*p[10] + m_xform[1][3]*p[14];
  m[1][3] = m_xform[1][0]*p[3] + m_xform[1][1]*p[7] + m_xform[1][2]*p[11] + m_xform[1][3]*p[15];

  m[2][0] = m_xform[2][0]*p[0] + m_xform[2][1]*p[4] + m_xform[2][2]*p[ 8] + m_xform[2][3]*p[12];
  m[2][1] = m_xform[2][0]*p[1] + m_xform[2][1]*p[5] + m_xform[2][2]*p[ 9] + m_xform[2][3]*p[13];
  m[2][2] = m_xform[2][0]*p[2] + m_xform[2][1]*p[6] + m_xform[2][2]*p[10] + m_xform[2][3]*p[14];
  m[2][3] = m_xform[2][0]*p[3] + m_xform[2][1]*p[7] + m_xform[2][2]*p[11] + m_xform[2][3]*p[15];

  m[3][0] = m_xform[3][0]*p[0] + m_xform[3][1]*p[4] + m_xform[3][2]*p[ 8] + m_xform[3][3]*p[12];
  m[3][1] = m_xform[3][0]*p[1] + m_xform[3][1]*p[5] + m_xform[3][2]*p[ 9] + m_xform[3][3]*p[13];
  m[3][2] = m_xform[3][0]*p[2] + m_xform[3][1]*p[6] + m_xform[3][2]*p[10] + m_xform[3][3]*p[14];
  m[3][3] = m_xform[3][0]*p[3] + m_xform[3][1]*p[7] + m_xform[3][2]*p[11] + m_xform[3][3]*p[15];

  return ON_Xform(m);
}